

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.h
# Opt level: O0

bool __thiscall pbrt::syntactic::ParamSet::hasParam3f(ParamSet *this,string *name)

{
  bool bVar1;
  element_type *peVar2;
  size_type sVar3;
  bool local_46;
  string *in_stack_ffffffffffffffd0;
  ParamSet *in_stack_ffffffffffffffd8;
  
  findParam<float>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)&stack0xffffffffffffffd8);
  local_46 = false;
  if (bVar1) {
    findParam<float>(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
    peVar2 = std::
             __shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<pbrt::syntactic::ParamArray<float>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x1a3d5a);
    sVar3 = std::vector<float,_std::allocator<float>_>::size
                      (&peVar2->super_vector<float,_std::allocator<float>_>);
    local_46 = sVar3 == 3;
    std::shared_ptr<pbrt::syntactic::ParamArray<float>_>::~shared_ptr
              ((shared_ptr<pbrt::syntactic::ParamArray<float>_> *)0x1a3d8e);
  }
  std::shared_ptr<pbrt::syntactic::ParamArray<float>_>::~shared_ptr
            ((shared_ptr<pbrt::syntactic::ParamArray<float>_> *)0x1a3d98);
  return local_46;
}

Assistant:

bool hasParam3f(const std::string &name) const {
        return (bool)findParam<float>(name) && findParam<float>(name)->size() == 3;
      }